

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O2

DecodeStatus DecodeLR2RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint Op2;
  uint Op1;
  
  DVar1 = Decode2OpInstruction(Insn & 0xffff,&Op1,&Op2);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,Op2,Address,Decoder);
    DecodeGRRegsRegisterClass(Inst,Op1,Address,Decoder);
    return MCDisassembler_Success;
  }
  DVar1 = DecodeL2OpInstructionFail(Inst,Insn,Address,Decoder);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeLR2RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2;
	DecodeStatus S = Decode2OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2);
	if (S != MCDisassembler_Success)
		return DecodeL2OpInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);

	return S;
}